

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint __thiscall llvm::dwarf::getVirtuality(dwarf *this,StringRef VirtualityString)

{
  StringRef S;
  uint uVar1;
  StringSwitch<unsigned_int,_unsigned_int> *pSVar2;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  dwarf *local_40;
  char *local_38;
  StringSwitch<unsigned_int,_unsigned_int> local_30;
  dwarf *local_18;
  StringRef VirtualityString_local;
  
  local_38 = VirtualityString.Data;
  S.Length = (size_t)local_38;
  S.Data = (char *)this;
  local_40 = this;
  local_18 = this;
  VirtualityString_local.Data = local_38;
  StringSwitch<unsigned_int,_unsigned_int>::StringSwitch(&local_30,S);
  StringLiteral::StringLiteral<19UL>((StringLiteral *)&local_50,(char (*) [19])"DW_VIRTUALITY_none")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(&local_30,(StringLiteral)local_50,0);
  StringLiteral::StringLiteral<22UL>
            ((StringLiteral *)&local_60,(char (*) [22])"DW_VIRTUALITY_virtual");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_60,1);
  StringLiteral::StringLiteral<27UL>
            ((StringLiteral *)&local_70,(char (*) [27])"DW_VIRTUALITY_pure_virtual");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_70,2);
  uVar1 = StringSwitch<unsigned_int,_unsigned_int>::Default(pSVar2,0xffffffff);
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getVirtuality(StringRef VirtualityString) {
  return StringSwitch<unsigned>(VirtualityString)
#define HANDLE_DW_VIRTUALITY(ID, NAME)                                         \
  .Case("DW_VIRTUALITY_" #NAME, DW_VIRTUALITY_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(DW_VIRTUALITY_invalid);
}